

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O2

bool __thiscall cmGetPropertyCommand::HandleTestMode(cmGetPropertyCommand *this)

{
  cmTest *this_00;
  char *value;
  ostream *poVar1;
  ostringstream e;
  string local_1b0;
  string local_190 [11];
  
  if ((this->Name)._M_string_length == 0) {
    std::__cxx11::string::string
              ((string *)local_190,"not given name for TEST scope.",(allocator *)&local_1b0);
    cmCommand::SetError(&this->super_cmCommand,local_190);
    std::__cxx11::string::~string((string *)local_190);
  }
  else {
    this_00 = cmMakefile::GetTest((this->super_cmCommand).Makefile,&this->Name);
    if (this_00 != (cmTest *)0x0) {
      value = cmTest::GetProperty(this_00,&this->PropertyName);
      StoreResult(this,value);
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    poVar1 = std::operator<<((ostream *)local_190,"given TEST name that does not exist: ");
    std::operator<<(poVar1,(string *)&this->Name);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  }
  return false;
}

Assistant:

bool cmGetPropertyCommand::HandleTestMode()
{
  if (this->Name.empty()) {
    this->SetError("not given name for TEST scope.");
    return false;
  }

  // Loop over all tests looking for matching names.
  if (cmTest* test = this->Makefile->GetTest(this->Name)) {
    return this->StoreResult(test->GetProperty(this->PropertyName));
  }

  // If not found it is an error.
  std::ostringstream e;
  e << "given TEST name that does not exist: " << this->Name;
  this->SetError(e.str());
  return false;
}